

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_internal.h
# Opt level: O3

void __thiscall
ctemplate::ModifierInfo::ModifierInfo
          (ModifierInfo *this,string *ln,char sn,XssClass xc,TemplateModifier *m)

{
  pointer pcVar1;
  char *pcVar2;
  
  (this->long_name)._M_dataplus._M_p = (pointer)&(this->long_name).field_2;
  pcVar1 = (ln->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + ln->_M_string_length);
  this->short_name = sn;
  pcVar2 = strchr((ln->_M_dataplus)._M_p,0x3d);
  this->modval_required = pcVar2 != (char *)0x0;
  this->is_registered = m != (TemplateModifier *)0x0;
  this->xss_class = xc;
  if (m == (TemplateModifier *)0x0) {
    m = (TemplateModifier *)&null_modifier;
  }
  this->modifier = m;
  return;
}

Assistant:

ModifierInfo(string ln, char sn, XssClass xc, const TemplateModifier* m)
      : long_name(ln), short_name(sn),
        modval_required(strchr(ln.c_str(), '=') != NULL),
        is_registered(m != NULL), xss_class(xc),
        modifier(m ? m : &null_modifier) { }